

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

void garray_const(_garray *x,t_floatarg g)

{
  _array *p_Var1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  int elemsize;
  int yonset;
  int local_10;
  int local_c;
  
  p_Var1 = garray_getarray_floatonly(x,&local_c,&local_10);
  if (p_Var1 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
  }
  else {
    uVar3 = 0;
    if (0 < p_Var1->a_n) {
      uVar3 = (ulong)(uint)p_Var1->a_n;
    }
    lVar2 = (long)local_c << 2;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      *(t_floatarg *)(p_Var1->a_vec + lVar2) = g;
      lVar2 = lVar2 + local_10;
    }
  }
  garray_redraw(x);
  return;
}

Assistant:

static void garray_const(t_garray *x, t_floatarg g)
{
    int yonset, i, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
    else for (i = 0; i < array->a_n; i++)
        *((t_float *)((char *)array->a_vec
            + elemsize * i) + yonset) = g;
    garray_redraw(x);
}